

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O1

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::Impl::loadModuleFromSearchPath(Impl *this,PathPtr path)

{
  ArrayDisposer *pAVar1;
  ArrayDisposer *pAVar2;
  String *dir;
  bool bVar3;
  PathPtr path_00;
  PathPtr path_01;
  GlobalErrorReporter *local_40;
  Impl *local_38;
  
  dir = path.parts.ptr;
  pAVar2 = (ArrayDisposer *)(dir->content).size_;
  pAVar1 = (dir->content).disposer;
  bVar3 = pAVar2 == pAVar1;
  local_38 = this;
  if (!bVar3) {
    path_00.parts.size_ = path.parts.size_;
    path_00.parts.ptr = (String *)pAVar2->_vptr_ArrayDisposer;
    loadModule((Impl *)&stack0xffffffffffffffc0,(ReadableDirectory *)dir,path_00);
    while (local_40 == (GlobalErrorReporter *)0x0) {
      pAVar2 = pAVar2 + 1;
      bVar3 = pAVar2 == pAVar1;
      if (bVar3) goto LAB_001141b7;
      path_01.parts.size_ = path.parts.size_;
      path_01.parts.ptr = (String *)pAVar2->_vptr_ArrayDisposer;
      loadModule((Impl *)&stack0xffffffffffffffc0,(ReadableDirectory *)dir,path_01);
    }
    if (!bVar3) goto LAB_001141b9;
  }
LAB_001141b7:
  local_40 = (GlobalErrorReporter *)0x0;
LAB_001141b9:
  ((ErrorReporter *)&local_38->errorReporter)->_vptr_ErrorReporter = (_func_int **)local_40;
  return (Maybe<capnp::compiler::Module_&>)(Module *)local_38;
}

Assistant:

kj::Maybe<Module&> ModuleLoader::Impl::loadModuleFromSearchPath(kj::PathPtr path) {
  for (auto candidate: searchPath) {
    KJ_IF_SOME(module, loadModule(*candidate, path)) {
      return module;
    }
  }
  return kj::none;
}